

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O2

void __thiscall
luna::Library::RegisterFunc(Library *this,Table *table,char *name,CFunctionType func)

{
  anon_union_8_9_8deb4486_for_Value_0 local_38;
  undefined4 local_30;
  anon_union_8_9_8deb4486_for_Value_0 local_28;
  undefined4 local_20;
  
  local_20 = 4;
  local_28.str_ = State::GetString(this->state_,name);
  local_30 = 9;
  local_38.cfunc_ = func;
  Table::SetValue(table,(Value *)&local_28,(Value *)&local_38);
  return;
}

Assistant:

void Library::RegisterFunc(Table *table, const char *name, CFunctionType func)
    {
        Value k;
        k.type_ = ValueT_String;
        k.str_ = state_->GetString(name);

        Value v;
        v.type_ = ValueT_CFunction;
        v.cfunc_ = func;
        table->SetValue(k, v);
    }